

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.cpp
# Opt level: O2

double __thiscall helper::log(helper *this,double __x)

{
  LogLevel in_ESI;
  double dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,'\n');
  logMultiline(&local_30,in_ESI);
  dVar1 = (double)std::__cxx11::string::~string((string *)&local_30);
  return dVar1;
}

Assistant:

inline void log( const String8 &text, LogLevel level )
	{
		logMultiline( text + '\n', level );
	}